

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

void __thiscall
TldDSAsKey::TldDSAsKey(TldDSAsKey *this,char *name,size_t name_len,bool has_ds,uint32_t algo_code)

{
  ulong local_40;
  size_t i_1;
  ulong uStack_30;
  int c;
  size_t i;
  uint32_t algo_code_local;
  bool has_ds_local;
  size_t name_len_local;
  char *name_local;
  TldDSAsKey *this_local;
  
  this->_vptr_TldDSAsKey = (_func_int **)&PTR__TldDSAsKey_002239d0;
  this->HashNext = (TldDSAsKey *)0x0;
  this->ds_count = (uint)has_ds;
  this->count = 1;
  this->hash = 0;
  _algo_code_local = name_len;
  if (0x3f < name_len) {
    _algo_code_local = 0x3f;
  }
  for (uStack_30 = 0; uStack_30 < _algo_code_local; uStack_30 = uStack_30 + 1) {
    i_1._4_1_ = name[uStack_30];
    if (('`' < (char)i_1._4_1_) && ((char)i_1._4_1_ < '{')) {
      i_1._4_1_ = i_1._4_1_ + 0xe0;
    }
    this->name[uStack_30] = i_1._4_1_;
  }
  for (local_40 = _algo_code_local; local_40 < 0x40; local_40 = local_40 + 1) {
    this->name[local_40] = '\0';
  }
  this->name_len = _algo_code_local;
  if (has_ds) {
    this->algo_nb = 1;
    this->algo_code[0] = algo_code;
    this->algo_count[0] = 1;
  }
  else {
    this->algo_nb = 0;
  }
  return;
}

Assistant:

TldDSAsKey::TldDSAsKey(const char * name, size_t name_len, bool has_ds, uint32_t algo_code)
    :
    HashNext(NULL),
    ds_count((has_ds)?1:0),
    count(1),
    hash(0)
{
    if (name_len > 63)
    {
        name_len = 63;
    }
    for (size_t i = 0; i < name_len; i++)
    {
        int c = name[i];
        if (c >= 'a' && c <= 'z')
        {
            c = c + 'A' - 'a';
        }
        this->name[i] = c;
    }

    for (size_t i = name_len; i < 64; i++)
    {
        this->name[i] = 0;
    }
    this->name_len = name_len;

    if (has_ds) {
        this->algo_nb = 1;
        this->algo_code[0] = algo_code;
        this->algo_count[0] = 1;
    }
    else {
        this->algo_nb = 0;
    }
}